

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerConversionFuncs(Builtins *this)

{
  shared_ptr<slang::ast::builtins::BitsToRealFunction> *in_stack_fffffffffffffe48;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffe50;
  shared_ptr<slang::ast::SystemSubroutine> *this_00;
  bool *in_stack_fffffffffffffe70;
  Builtins *in_stack_fffffffffffffe78;
  Builtins *__args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffee0;
  Builtins *in_stack_fffffffffffffee8;
  undefined1 local_65;
  undefined4 local_64;
  undefined1 local_2d;
  undefined4 local_2c;
  
  local_2c = 0x12;
  local_2d = 1;
  std::
  make_shared<slang::ast::builtins::SignedConversionFunction,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SignedConversionFunction,void>
            (in_stack_fffffffffffffe50,
             (shared_ptr<slang::ast::builtins::SignedConversionFunction> *)in_stack_fffffffffffffe48
            );
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927d42);
  std::shared_ptr<slang::ast::builtins::SignedConversionFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SignedConversionFunction> *)0x927d4f);
  local_64 = 0x13;
  local_65 = 0;
  std::
  make_shared<slang::ast::builtins::SignedConversionFunction,slang::parsing::KnownSystemName,bool>
            ((KnownSystemName *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::SignedConversionFunction,void>
            (in_stack_fffffffffffffe50,
             (shared_ptr<slang::ast::builtins::SignedConversionFunction> *)in_stack_fffffffffffffe48
            );
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927dbc);
  std::shared_ptr<slang::ast::builtins::SignedConversionFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SignedConversionFunction> *)0x927dc9);
  std::make_shared<slang::ast::builtins::RtoIFunction,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffe78);
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::RtoIFunction,void>
            (in_stack_fffffffffffffe50,
             (shared_ptr<slang::ast::builtins::RtoIFunction> *)in_stack_fffffffffffffe48);
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927e1b);
  std::shared_ptr<slang::ast::builtins::RtoIFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RtoIFunction> *)0x927e28);
  std::make_shared<slang::ast::builtins::ItoRFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::ItoRFunction,void>
            (in_stack_fffffffffffffe50,
             (shared_ptr<slang::ast::builtins::ItoRFunction> *)in_stack_fffffffffffffe48);
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927e72);
  std::shared_ptr<slang::ast::builtins::ItoRFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ItoRFunction> *)0x927e7f);
  std::make_shared<slang::ast::builtins::RealToBitsFunction,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffe78);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealToBitsFunction,void>
            (in_stack_fffffffffffffe50,
             (shared_ptr<slang::ast::builtins::RealToBitsFunction> *)in_stack_fffffffffffffe48);
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927ed1);
  std::shared_ptr<slang::ast::builtins::RealToBitsFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealToBitsFunction> *)0x927ede);
  std::make_shared<slang::ast::builtins::BitsToRealFunction,slang::ast::builtins::Builtins&>
            (in_stack_fffffffffffffe78);
  __args = (Builtins *)&stack0xffffffffffffff28;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::BitsToRealFunction,void>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927f30);
  std::shared_ptr<slang::ast::builtins::BitsToRealFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::BitsToRealFunction> *)0x927f3d);
  std::make_shared<slang::ast::builtins::ShortRealToBitsFunction,slang::ast::builtins::Builtins&>
            (__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ShortRealToBitsFunction,void>
            (in_stack_fffffffffffffe50,
             (shared_ptr<slang::ast::builtins::ShortRealToBitsFunction> *)in_stack_fffffffffffffe48)
  ;
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927f8f);
  std::shared_ptr<slang::ast::builtins::ShortRealToBitsFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ShortRealToBitsFunction> *)0x927f9c);
  this_00 = (shared_ptr<slang::ast::SystemSubroutine> *)&stack0xfffffffffffffed8;
  std::make_shared<slang::ast::builtins::BitsToShortRealFunction,slang::ast::builtins::Builtins&>
            (__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::BitsToShortRealFunction,void>
            (this_00,(shared_ptr<slang::ast::builtins::BitsToShortRealFunction> *)
                     in_stack_fffffffffffffe48);
  addSystemSubroutine(in_stack_fffffffffffffee8,
                      (shared_ptr<slang::ast::SystemSubroutine> *)in_stack_fffffffffffffee0._M_pi);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x927fee);
  std::shared_ptr<slang::ast::builtins::BitsToShortRealFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::BitsToShortRealFunction> *)0x927ffb);
  return;
}

Assistant:

void Builtins::registerConversionFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name, ...) addSystemSubroutine(std::make_shared<name##Function>(__VA_ARGS__))
    REGISTER(SignedConversion, KnownSystemName::Signed, true);
    REGISTER(SignedConversion, KnownSystemName::Unsigned, false);

    REGISTER(RtoI, *this);
    REGISTER(ItoR, );
    REGISTER(RealToBits, *this);
    REGISTER(BitsToReal, *this);
    REGISTER(ShortRealToBits, *this);
    REGISTER(BitsToShortReal, *this);
#undef REGISTER
}